

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_list.c
# Opt level: O2

int apprun_string_list_len(char **x)

{
  char *pcVar1;
  int iVar2;
  
  if (x != (char **)0x0) {
    iVar2 = -1;
    do {
      iVar2 = iVar2 + 1;
      pcVar1 = *x;
      x = x + 1;
    } while (pcVar1 != (char *)0x0);
    return iVar2;
  }
  return 0;
}

Assistant:

int apprun_string_list_len(char *const *x) {
    if (x == NULL)
        return 0;

    int len = 0;
    while (x[len] != 0)
        len++;

    return len;
}